

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1555.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uStack_20;
  
  iVar1 = curl_global_init(3);
  uVar3 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar3,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1555.c"
                  ,0x38,iVar1,uVar2);
    return iVar1;
  }
  curl = (CURL *)curl_easy_init();
  if (curl == (CURL *)0x0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1555.c"
                  ,0x3a);
    iVar1 = 0x7c;
  }
  else {
    iVar1 = curl_easy_setopt(curl,0x2712,URL);
    uVar3 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(curl,0xd,7);
      uVar3 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(curl,99,1);
        uVar3 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(curl,0x4e58,progressCallback);
          uVar3 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(curl,0x2749,0);
            uVar3 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_easy_setopt(curl,0x2b,0);
              uVar3 = _stderr;
              if (iVar1 == 0) {
                iVar1 = curl_easy_perform(curl);
                goto LAB_0010243d;
              }
              uVar2 = curl_easy_strerror(iVar1);
              uStack_20 = 0x41;
            }
            else {
              uVar2 = curl_easy_strerror(iVar1);
              uStack_20 = 0x40;
            }
          }
          else {
            uVar2 = curl_easy_strerror(iVar1);
            uStack_20 = 0x3f;
          }
        }
        else {
          uVar2 = curl_easy_strerror(iVar1);
          uStack_20 = 0x3e;
        }
      }
      else {
        uVar2 = curl_easy_strerror(iVar1);
        uStack_20 = 0x3d;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      uStack_20 = 0x3c;
    }
    curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1555.c"
                  ,uStack_20,iVar1,uVar2);
  }
LAB_0010243d:
  curl_easy_cleanup(curl);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_TIMEOUT, (long)7);
  easy_setopt(curl, CURLOPT_NOSIGNAL, (long)1);
  easy_setopt(curl, CURLOPT_PROGRESSFUNCTION, progressCallback);
  easy_setopt(curl, CURLOPT_PROGRESSDATA, NULL);
  easy_setopt(curl, CURLOPT_NOPROGRESS, (long)0);

  res = curl_easy_perform(curl);

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}